

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusArcIntersect.cpp
# Opt level: O3

int TestLocusArcIntersect(string *sFilePath)

{
  long lVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  string sLine1;
  string sLine3;
  string sLine2;
  ifstream infile;
  char *local_2f8;
  long local_2f0;
  char local_2e8 [16];
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  undefined1 *local_2b8;
  long local_2b0;
  undefined1 local_2a8 [16];
  string local_298;
  string local_278;
  string local_258;
  long local_238 [3];
  undefined4 uStack_21c;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238);
  lVar1 = *(long *)(local_238[0] + -0x18);
  *(undefined4 *)((long)&uStack_21c + lVar1) = 7;
  std::ios::clear((int)&local_2f8 + (int)lVar1 + 0xc0);
  local_2f8 = local_2e8;
  local_2f0 = 0;
  local_2e8[0] = '\0';
  local_2b8 = local_2a8;
  local_2b0 = 0;
  local_2a8[0] = 0;
  local_2d8 = local_2c8;
  local_2d0 = 0;
  local_2c8[0] = 0;
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(sFilePath->_M_dataplus)._M_p);
  lVar1 = *(long *)(local_238[0] + -0x18);
  bVar7 = 1;
  if ((abStack_218[lVar1] & 2) == 0) {
    bVar6 = 1;
    bVar7 = 1;
    do {
      cVar2 = std::ios::widen((char)&local_2f8 + (char)lVar1 + -0x40);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_2f8,cVar2);
      if (local_2f0 == 0) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0
                          );
        std::ifstream::~ifstream(local_238);
        _Unwind_Resume(uVar5);
      }
      if (*local_2f8 != '#') {
        cVar2 = (char)(istream *)local_238;
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_2b8,cVar3);
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_2d8,cVar2);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_2f8,local_2f8 + local_2f0);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_2b8,local_2b8 + local_2b0);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_2d8,local_2d8 + local_2d0);
        bVar4 = ParseLocusArcIntersect(&local_258,&local_278,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        bVar7 = bVar6;
        if (!bVar4) {
          bVar6 = 0;
          bVar7 = 0;
        }
      }
      lVar1 = *(long *)(local_238[0] + -0x18);
    } while ((abStack_218[lVar1] & 2) == 0);
  }
  std::ifstream::close();
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  std::ifstream::~ifstream(local_238);
  return (uint)bVar7;
}

Assistant:

int TestLocusArcIntersect(const string &sFilePath)
{
    ifstream infile;
    infile.exceptions(ifstream::eofbit | ifstream::failbit | ifstream::badbit);
    int nCount = 0;
    int nCommentCount = 0;
    bool bPassed = true;
    try
    {
        string sLine1, sLine2, sLine3;
        infile.open(sFilePath.c_str(), ifstream::in);

        while (!infile.eof())
        {
            getline(infile, sLine1);
            if (sLine1.at(0) == '#')
            {
                nCommentCount++;
            }
            else
            {
                getline(infile, sLine2);
                getline(infile, sLine3);
                if (!ParseLocusArcIntersect(sLine1, sLine2, sLine3))
                    bPassed = false;
                nCount++;
            }
        }
        infile.close();
        return bPassed;
    }

    catch (ifstream::failure e)
    {
        int nError = -99;
        // Per C++ standards for ifstream::failbit with global function getline
        // No characters were extracted because the end was prematurely found.Notice
        // that some eofbit cases will also set failbit.
        // In this case the end of the file is read and causes both flags to be raised,
        // so this presumably means all the data has been read correctly.
        if ((infile.rdstate() & ifstream::failbit) && (infile.rdstate() & ifstream::eofbit) != 0)
            nError = bPassed;
        else if ((infile.rdstate() & ifstream::failbit) != 0)
            nError = -1;
        else if ((infile.rdstate() & ifstream::badbit) != 0)
            nError = -2;
        else if ((infile.rdstate() & ifstream::eofbit) != 0)
            nError = -3;
        if (infile.is_open())
            infile.close();
        return nError;
    }
}